

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O2

bool __thiscall FIX::SessionState::set(SessionState *this,SEQNUM s,string *m)

{
  int iVar1;
  
  Mutex::lock(&this->m_mutex);
  iVar1 = (*this->m_pStore->_vptr_MessageStore[2])(this->m_pStore,s,m);
  Mutex::unlock(&this->m_mutex);
  return SUB41(iVar1,0);
}

Assistant:

EXCEPT(IOException) {
    Locker l(m_mutex);
    return m_pStore->set(s, m);
  }